

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

date_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMicrosBinaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t>
          (WidthConvertibleToMicrosBinaryOperator *this,interval_t bucket_width,date_t ts)

{
  bool bVar1;
  long right;
  long lVar2;
  timestamp_t tVar3;
  date_t dVar4;
  long right_00;
  long left;
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  date_t result;
  timestamp_t local_50;
  string local_48;
  WidthConvertibleToMicrosBinaryOperator *local_28;
  int64_t local_20;
  
  local_20 = bucket_width._0_8_;
  dVar4.days = bucket_width.micros._0_4_;
  local_28 = this;
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(dVar4);
  if (bVar1) {
    right = duckdb::Interval::GetMicro((interval_t *)&local_28);
    bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar4,&local_50,false);
    if (!bVar1) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_48,(duckdb *)(ulong)(uint)dVar4.days,(date_t)auVar6._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar6._0_8_,(string *)&local_48);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    tVar3.value._4_4_ = local_50.value._4_4_;
    tVar3.value._0_4_ = (int32_t)local_50.value;
    lVar2 = duckdb::Timestamp::GetEpochMicroSeconds(tVar3);
    right_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x35d2976e6a000)) % SEXT816(right),0);
    lVar2 = SubtractOperatorOverflowCheck::Operation<long,long,long>(lVar2,right_00);
    left = lVar2 - lVar2 % right;
    if (lVar2 % right != 0 && lVar2 < 0) {
      left = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,right);
    }
    tVar3.value = duckdb::Timestamp::FromEpochMicroSeconds(left + right_00);
    bVar1 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>
                      (tVar3,(date_t *)&local_50,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                (&local_48,(duckdb *)tVar3.value,(timestamp_t)auVar5._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_48);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::date_t>
                      (dVar4,(date_t *)&local_50,false);
    if (!bVar1) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_48,(duckdb *)(ulong)(uint)dVar4.days,(date_t)auVar6._8_4_);
      duckdb::InvalidInputException::InvalidInputException(auVar6._0_8_,(string *)&local_48);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (date_t)(int32_t)local_50.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS));
		}